

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

void Js::JavascriptOperators::IteratorClose(RecyclableObject *iterator,ScriptContext *scriptContext)

{
  ThreadContext *this;
  bool bVar1;
  Attributes attributes;
  Var pvVar2;
  RecyclableObject *function;
  JavascriptMethod p_Var3;
  ImplicitCallFlags IVar4;
  undefined1 uVar5;
  Arguments local_50;
  RecyclableObject *local_40;
  Var args [1];
  
  pvVar2 = GetProperty(iterator,iterator,0x135,scriptContext,(PropertyValueInfo *)0x0);
  bVar1 = JavascriptConversion::IsCallable(pvVar2);
  if (!bVar1) {
    return;
  }
  function = VarTo<Js::RecyclableObject>(pvVar2);
  this = scriptContext->threadContext;
  uVar5 = this->reentrancySafeOrHandled;
  this->reentrancySafeOrHandled = true;
  attributes = FunctionInfo::GetAttributes(function);
  bVar1 = ThreadContext::HasNoSideEffect(this,function,attributes);
  local_40 = iterator;
  args[0]._7_1_ = uVar5;
  if (bVar1) {
    p_Var3 = RecyclableObject::GetEntryPoint(function);
    local_50.Info = (Type)0x2000001;
    local_50.Values = &local_40;
    pvVar2 = JavascriptFunction::CallFunction<true>(function,p_Var3,&local_50,false);
    bVar1 = ThreadContext::IsOnStack(pvVar2);
LAB_00ac0695:
    if (bVar1 == false) goto LAB_00ac0708;
LAB_00ac06ea:
    IVar4 = this->implicitCallFlags;
  }
  else {
    if ((this->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag)
    goto LAB_00ac06ea;
    if ((attributes & HasNoSideEffect) != None) {
      p_Var3 = RecyclableObject::GetEntryPoint(function);
      local_50.Info = (Type)0x2000001;
      local_50.Values = &local_40;
      pvVar2 = JavascriptFunction::CallFunction<true>(function,p_Var3,&local_50,false);
      bVar1 = ThreadContext::IsOnStack(pvVar2);
      goto LAB_00ac0695;
    }
    IVar4 = this->implicitCallFlags;
    p_Var3 = RecyclableObject::GetEntryPoint(function);
    local_50.Info = (Type)0x2000001;
    local_50.Values = &local_40;
    JavascriptFunction::CallFunction<true>(function,p_Var3,&local_50,false);
  }
  this->implicitCallFlags = IVar4 | ImplicitCall_Accessor;
  uVar5 = args[0]._7_1_;
LAB_00ac0708:
  this->reentrancySafeOrHandled = (bool)uVar5;
  return;
}

Assistant:

void JavascriptOperators::IteratorClose(RecyclableObject* iterator, ScriptContext* scriptContext)
    {
        try
        {
            Var func = JavascriptOperators::GetProperty(iterator, PropertyIds::return_, scriptContext);

            if (JavascriptConversion::IsCallable(func))
            {
                RecyclableObject* callable = VarTo<RecyclableObject>(func);
                scriptContext->GetThreadContext()->ExecuteImplicitCall(callable, ImplicitCall_Accessor, [=]()->Var
                {
                    Js::Var args[] = { iterator };
                    Js::CallInfo callInfo(Js::CallFlags_Value, _countof(args));
                    return JavascriptFunction::CallFunction<true>(callable, callable->GetEntryPoint(), Js::Arguments(callInfo, args));
                });
            }
        }
        catch (const JavascriptException& err)
        {
            err.GetAndClear();  // discard exception object
            // We have arrived in this function due to AbruptCompletion (which is an exception), so we don't need to
            // propagate the exception of calling return function
        }
    }